

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t is_nfs4_flags(char *start,char *end,wchar_t *permset)

{
  char *pcVar1;
  char *local_30;
  char *p;
  wchar_t *permset_local;
  char *end_local;
  char *start_local;
  
  local_30 = start;
  while (local_30 < end) {
    pcVar1 = local_30 + 1;
    switch(*local_30) {
    case '-':
      local_30 = pcVar1;
      break;
    default:
      return L'\0';
    case 'F':
      *permset = *permset | 0x40000000;
      local_30 = pcVar1;
      break;
    case 'I':
      *permset = *permset | 0x1000000;
      local_30 = pcVar1;
      break;
    case 'S':
      *permset = *permset | 0x20000000;
      local_30 = pcVar1;
      break;
    case 'd':
      *permset = *permset | 0x4000000;
      local_30 = pcVar1;
      break;
    case 'f':
      *permset = *permset | 0x2000000;
      local_30 = pcVar1;
      break;
    case 'i':
      *permset = *permset | 0x10000000;
      local_30 = pcVar1;
      break;
    case 'n':
      *permset = *permset | 0x8000000;
      local_30 = pcVar1;
    }
  }
  return L'\x01';
}

Assistant:

static int
is_nfs4_flags(const char *start, const char *end, int *permset)
{
	const char *p = start;

	while (p < end) {
		switch(*p++) {
		case 'f':
			*permset |= ARCHIVE_ENTRY_ACL_ENTRY_FILE_INHERIT;
			break;
		case 'd':
			*permset |= ARCHIVE_ENTRY_ACL_ENTRY_DIRECTORY_INHERIT;
			break;
		case 'i':
			*permset |= ARCHIVE_ENTRY_ACL_ENTRY_INHERIT_ONLY;
			break;
		case 'n':
			*permset |=
			    ARCHIVE_ENTRY_ACL_ENTRY_NO_PROPAGATE_INHERIT;
			break;
		case 'S':
			*permset |= ARCHIVE_ENTRY_ACL_ENTRY_SUCCESSFUL_ACCESS;
			break;
		case 'F':
			*permset |= ARCHIVE_ENTRY_ACL_ENTRY_FAILED_ACCESS;
			break;
		case 'I':
			*permset |= ARCHIVE_ENTRY_ACL_ENTRY_INHERITED;
			break;
		case '-':
			break;
		default:
			return (0);
		}
	}
	return (1);
}